

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::
strTree<char_const(&)[5],char_const(&)[3],kj::CappedArray<char,17ul>,char_const(&)[19],unsigned_long,char_const(&)[3],unsigned_int,char_const(&)[11]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [5],char (*params_1) [3],
          CappedArray<char,_17UL> *params_2,char (*params_3) [19],unsigned_long *params_4,
          char (*params_5) [3],uint *params_6,char (*params_7) [11])

{
  ArrayPtr<const_char> *params_7_00;
  ArrayPtr<const_char> local_d0;
  undefined1 local_c0 [40];
  size_t local_98;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  CappedArray<char,_26UL> local_70;
  CappedArray<char,_14UL> local_48;
  
  local_c0._8_8_ = strlen((char *)this);
  local_c0._0_8_ = this;
  local_d0.size_ = strlen(*params);
  local_80.size_ = *(size_t *)params_1;
  local_80.ptr = params_1[2] + 2;
  local_d0.ptr = *params;
  local_90.size_ = strlen((char *)params_2);
  local_90.ptr = (char *)params_2;
  _::Stringifier::operator*(&local_70,(Stringifier *)&_::STR,*(unsigned_long *)*params_3);
  local_98 = strlen((char *)params_4);
  local_c0._32_8_ = params_4;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(uint *)params_5);
  params_7_00 = (ArrayPtr<const_char> *)0x166f81;
  local_c0._24_8_ = strlen((char *)params_6);
  local_c0._16_8_ = params_6;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)local_c0,&local_d0,&local_80,&local_90,
             (ArrayPtr<const_char> *)&local_70,(CappedArray<char,_26UL> *)(local_c0 + 0x20),
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)(local_c0 + 0x10),
             params_7_00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}